

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

int __thiscall
testing::internal::UnitTestImpl::FilterTests(UnitTestImpl *this,ReactionToSharding shard_tests)

{
  pointer ppTVar1;
  TestSuite *pTVar2;
  pointer ppTVar3;
  TestInfo *pTVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  byte bVar8;
  ulong uVar9;
  int iVar10;
  bool bVar11;
  string local_98;
  undefined1 local_78 [8];
  string test_name;
  int local_40;
  allocator<char> local_35;
  int local_34;
  
  if (shard_tests == HONOR_SHARDING_PROTOCOL) {
    local_40 = Int32FromEnvOrDie("GTEST_TOTAL_SHARDS",-1);
    iVar7 = Int32FromEnvOrDie("GTEST_SHARD_INDEX",-1);
  }
  else {
    iVar7 = -1;
    local_40 = iVar7;
  }
  ppTVar1 = (this->test_suites_).
            super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  iVar10 = 0;
  local_34 = 0;
  for (test_name.field_2._8_8_ =
            (this->test_suites_).
            super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>._M_impl.
            super__Vector_impl_data._M_start; (pointer)test_name.field_2._8_8_ != ppTVar1;
      test_name.field_2._8_8_ = test_name.field_2._8_8_ + 8) {
    pTVar2 = *(TestSuite **)test_name.field_2._8_8_;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,(pTVar2->name_)._M_dataplus._M_p,(allocator<char> *)local_78);
    pTVar2->should_run_ = false;
    for (uVar9 = 0;
        ppTVar3 = (pTVar2->test_info_list_).
                  super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>.
                  _M_impl.super__Vector_impl_data._M_start,
        uVar9 < (ulong)((long)(pTVar2->test_info_list_).
                              super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar3 >> 3);
        uVar9 = uVar9 + 1) {
      pTVar4 = ppTVar3[uVar9];
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_78,(pTVar4->name_)._M_dataplus._M_p,&local_35);
      bVar5 = UnitTestOptions::MatchesFilter(&local_98,"DISABLED_*:*/DISABLED_*");
      bVar6 = true;
      if (!bVar5) {
        bVar6 = UnitTestOptions::MatchesFilter((string *)local_78,"DISABLED_*:*/DISABLED_*");
      }
      pTVar4->is_disabled_ = bVar6;
      bVar5 = UnitTestOptions::FilterMatchesTest(&local_98,(string *)local_78);
      pTVar4->matches_filter_ = bVar5;
      bVar11 = local_34 % local_40 != iVar7;
      bVar8 = bVar5 & (bVar6 ^ 1U | FLAGS_gtest_also_run_disabled_tests);
      pTVar4->is_in_another_shard_ = shard_tests != IGNORE_SHARDING_PROTOCOL && bVar11;
      bVar5 = (bool)((shard_tests == IGNORE_SHARDING_PROTOCOL || !bVar11) & bVar8);
      local_34 = local_34 + (uint)bVar8;
      iVar10 = iVar10 + (uint)bVar5;
      pTVar4->should_run_ = bVar5;
      pTVar2->should_run_ = (bool)(pTVar2->should_run_ | bVar5);
      std::__cxx11::string::~string((string *)local_78);
    }
    std::__cxx11::string::~string((string *)&local_98);
  }
  return iVar10;
}

Assistant:

int UnitTestImpl::FilterTests(ReactionToSharding shard_tests) {
  const int32_t total_shards = shard_tests == HONOR_SHARDING_PROTOCOL ?
      Int32FromEnvOrDie(kTestTotalShards, -1) : -1;
  const int32_t shard_index = shard_tests == HONOR_SHARDING_PROTOCOL ?
      Int32FromEnvOrDie(kTestShardIndex, -1) : -1;

  // num_runnable_tests are the number of tests that will
  // run across all shards (i.e., match filter and are not disabled).
  // num_selected_tests are the number of tests to be run on
  // this shard.
  int num_runnable_tests = 0;
  int num_selected_tests = 0;
  for (auto* test_suite : test_suites_) {
    const std::string& test_suite_name = test_suite->name();
    test_suite->set_should_run(false);

    for (size_t j = 0; j < test_suite->test_info_list().size(); j++) {
      TestInfo* const test_info = test_suite->test_info_list()[j];
      const std::string test_name(test_info->name());
      // A test is disabled if test suite name or test name matches
      // kDisableTestFilter.
      const bool is_disabled = internal::UnitTestOptions::MatchesFilter(
                                   test_suite_name, kDisableTestFilter) ||
                               internal::UnitTestOptions::MatchesFilter(
                                   test_name, kDisableTestFilter);
      test_info->is_disabled_ = is_disabled;

      const bool matches_filter = internal::UnitTestOptions::FilterMatchesTest(
          test_suite_name, test_name);
      test_info->matches_filter_ = matches_filter;

      const bool is_runnable =
          (GTEST_FLAG_GET(also_run_disabled_tests) || !is_disabled) &&
          matches_filter;

      const bool is_in_another_shard =
          shard_tests != IGNORE_SHARDING_PROTOCOL &&
          !ShouldRunTestOnShard(total_shards, shard_index, num_runnable_tests);
      test_info->is_in_another_shard_ = is_in_another_shard;
      const bool is_selected = is_runnable && !is_in_another_shard;

      num_runnable_tests += is_runnable;
      num_selected_tests += is_selected;

      test_info->should_run_ = is_selected;
      test_suite->set_should_run(test_suite->should_run() || is_selected);
    }
  }
  return num_selected_tests;
}